

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  ulong uVar1;
  pointer prVar2;
  merged_constraint *cst;
  pointer pmVar3;
  pointer pfVar4;
  size_type __n;
  ulong uVar5;
  long lVar6;
  long lVar7;
  merged_constraint *cst_1;
  pointer pmVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  pointer prVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  double dVar18;
  allocator_type local_81;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  
  __n = 0;
  for (pmVar3 = (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pmVar3 != (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish; pmVar3 = pmVar3 + 1) {
    uVar10 = (ulong)((long)(pmVar3->elements).
                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar3->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar5 = uVar10 & 0xffffffff;
    if ((int)uVar10 < (int)__n) {
      uVar5 = __n;
    }
    __n = uVar5;
  }
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&R,__n,&local_81);
  pmVar3 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pmVar8 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pmVar8 == pmVar3) {
      std::_Vector_base<reduced_cost,_std::allocator<reduced_cost>_>::~_Vector_base
                (&R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>);
      return;
    }
    dVar18 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
    if (dVar18 < init_random) {
      std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                (&R,(long)(pmVar8->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar8->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
      pfVar4 = (pmVar8->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(pmVar8->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar4;
      uVar10 = uVar5 >> 3 & 0xffffffff;
      lVar7 = 4;
      for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
        fVar17 = quadratic_cost_type<float>::operator[](c,pfVar4[uVar15].variable_index);
        *(float *)((long)R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar7 + -4) = fVar17;
        pfVar4 = (pmVar8->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(function_element *)
         ((long)&(R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                  super__Vector_impl_data._M_start)->value + lVar7) = pfVar4[uVar15];
        lVar7 = lVar7 + 0xc;
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_finish,rng);
      std::
      __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar9 = 0;
        lVar6 = (long)(int)(uVar5 >> 3);
        lVar7 = -1;
        do {
          piVar12 = &R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7].factor;
          do {
            if (lVar6 <= lVar7) {
              lVar7 = -2;
LAB_001561d0:
              lVar6 = 8;
              uVar15 = uVar10;
              for (lVar14 = 0; lVar14 <= (int)lVar7; lVar14 = lVar14 + 1) {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar6));
                lVar6 = lVar6 + 0xc;
                uVar15 = uVar15 - 1;
              }
              while (bVar16 = uVar15 != 0, uVar15 = uVar15 - 1, bVar16) {
                bit_array_impl::unset
                          (&x_pessimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar6));
                lVar6 = lVar6 + 0xc;
              }
              goto LAB_00156222;
            }
            if ((pmVar8->min <= iVar9) && (iVar9 <= pmVar8->max)) goto LAB_001561d0;
            lVar7 = lVar7 + 1;
            piVar12 = piVar12 + 3;
          } while (lVar6 <= lVar7);
          iVar9 = iVar9 + *piVar12;
        } while( true );
      }
LAB_00156222:
      if ((x_optimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar9 = 0;
        lVar7 = (long)(int)(uVar5 >> 3);
        uVar5 = 0xffffffffffffffff;
        uVar15 = 0xfffffffffffffffe;
        do {
          prVar2 = R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar5 + 1;
          do {
            prVar13 = prVar2;
            iVar11 = (int)uVar15;
            if (lVar7 <= (long)uVar5) {
LAB_001562a1:
              lVar7 = 8;
              for (lVar6 = 0; lVar6 <= iVar11; lVar6 = lVar6 + 1) {
                bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar7));
                lVar7 = lVar7 + 0xc;
                uVar10 = uVar10 - 1;
              }
              while (bVar16 = uVar10 != 0, uVar10 = uVar10 - 1, bVar16) {
                bit_array_impl::unset
                          (&x_optimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar7));
                lVar7 = lVar7 + 0xc;
              }
              goto LAB_001562f0;
            }
            uVar1 = uVar5;
            if (pmVar8->max < iVar9) {
              uVar1 = uVar15;
            }
            if (iVar9 < pmVar8->min) {
              uVar1 = uVar15;
            }
            uVar15 = uVar1 & 0xffffffff;
            uVar5 = uVar5 + 1;
            iVar11 = (int)uVar1;
            if (((iVar11 != -2) && ((long)uVar5 < lVar7)) && (0.0 < prVar13->value))
            goto LAB_001562a1;
            prVar2 = prVar13 + 1;
          } while (lVar7 <= (long)uVar5);
          iVar9 = iVar9 + prVar13->factor;
        } while( true );
      }
    }
LAB_001562f0:
    pmVar8 = pmVar8 + 1;
  } while( true );
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}